

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxLexer.cpp
# Opt level: O2

void __thiscall Jinx::Impl::Lexer::ParseWhitespace(Lexer *this)

{
  char cVar1;
  
  do {
    cVar1 = *this->m_current;
    if ((cVar1 == '\0') || (this->m_end < this->m_current)) goto LAB_001c838f;
    if (cVar1 != ' ') {
      if (cVar1 != '\t') {
LAB_001c838f:
        this->m_columnMarker = this->m_columnNumber;
        return;
      }
      this->m_columnNumber = this->m_columnNumber + 3;
    }
    AdvanceCurrent(this);
  } while( true );
}

Assistant:

inline_t void Lexer::ParseWhitespace()
	{
		while (!IsEndOfText())
		{
			if (!IsWhitespace(*m_current))
				break;
			if (*m_current == '\t')
				m_columnNumber += (LogTabWidth - 1);
			AdvanceCurrent();
		}
		m_columnMarker = m_columnNumber;
	}